

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O3

int open_file(char *filename,coda_product **product_file,int force_binary)

{
  long lVar1;
  ulong uVar2;
  undefined1 auVar3 [14];
  undefined1 auVar4 [12];
  unkbyte10 Var5;
  int iVar6;
  int *piVar7;
  char *pcVar8;
  undefined4 uVar9;
  coda_cursor *cursor;
  long lVar10;
  byte bVar11;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  undefined1 auVar12 [16];
  char cVar16;
  char cVar27;
  char cVar28;
  char cVar29;
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar26 [16];
  coda_product *product;
  uchar buffer [80];
  coda_product *local_3a0;
  uint8_t local_398;
  char cStack_397;
  char cStack_396;
  byte bStack_395;
  uint8_t uStack_394;
  char cStack_393;
  char cStack_392;
  char cStack_391;
  uint8_t uStack_390;
  char cStack_38f;
  char cStack_38e;
  char cStack_38d;
  char cStack_38c;
  char cStack_38b;
  char cStack_38a;
  char cStack_389;
  char local_388;
  char cStack_385;
  char local_379;
  char local_371;
  coda_cursor local_340;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar17 [13];
  undefined1 auVar19 [16];
  undefined1 auVar25 [16];
  undefined1 auVar21 [16];
  undefined1 auVar20 [16];
  undefined2 uVar30;
  
  if (filename == (char *)0x0) {
    __assert_fail("filename != NULL && file_size != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                  ,0x9d,"int get_file_size(const char *, int64_t *)");
  }
  iVar6 = stat(filename,(stat *)&local_340);
  if (iVar6 != 0) {
    piVar7 = __errno_location();
    if (*piVar7 != 2) {
      pcVar8 = strerror(*piVar7);
      coda_set_error(-0x15,"could not open %s (%s)",filename,pcVar8);
      return -1;
    }
    pcVar8 = "could not find %s";
    iVar6 = -0x14;
LAB_0014e4b0:
    coda_set_error(iVar6,pcVar8,filename);
    return -1;
  }
  if ((local_340.stack[0].index._1_1_ & 0x80) == 0) {
    pcVar8 = "could not open %s (not a regular file)";
    iVar6 = -0x15;
    goto LAB_0014e4b0;
  }
  iVar6 = coda_bin_open(filename,local_340.stack[1].index,&local_3a0);
  if (iVar6 != 0) {
    return -1;
  }
  if (force_binary != 0) goto LAB_0014e515;
  uVar2 = local_3a0->file_size;
  iVar6 = coda_cursor_set_product(&local_340,local_3a0);
  if (iVar6 != 0) goto LAB_0014e538;
  if ((long)uVar2 < 4) goto LAB_0014e515;
  iVar6 = coda_cursor_read_bytes(&local_340,&local_398,0,4);
  if (iVar6 != 0) goto LAB_0014e538;
  if (((cStack_396 == 'F' && CONCAT11(cStack_397,local_398) == 0x4443) && (bStack_395 < 6)) &&
     ((0x26U >> (bStack_395 & 0x1f) & 1) != 0)) {
    iVar6 = coda_netcdf_reopen(&local_3a0);
  }
  else {
    if (CONCAT13(bStack_395,CONCAT12(cStack_396,CONCAT11(cStack_397,local_398))) == 0x113030e) {
      iVar6 = -0xb;
LAB_0014e589:
      coda_set_error(iVar6,(char *)0x0);
      goto LAB_0014e538;
    }
    if (uVar2 < 8) goto LAB_0014e515;
    iVar6 = coda_cursor_read_bytes(&local_340,&uStack_394,4,4);
    if (iVar6 != 0) goto LAB_0014e538;
    iVar6 = CONCAT13(bStack_395,CONCAT12(cStack_396,CONCAT11(cStack_397,local_398)));
    lVar10 = CONCAT17(cStack_391,
                      CONCAT16(cStack_392,CONCAT15(cStack_393,CONCAT14(uStack_394,iVar6))));
    if (lVar10 < 0x100cccc0100f3cd) {
      if (((lVar10 == -0xfffffeff0c33) || (lVar10 == -0xfffffd9f0d33)) ||
         (lVar10 == -0xffff00010000)) {
LAB_0014e664:
        iVar6 = coda_cdf_reopen(&local_3a0);
        goto LAB_0014e5b2;
      }
    }
    else {
      if ((lVar10 == 0x100cccc0100f3cd) || (lVar10 == 0x100cccc0260f2cd)) goto LAB_0014e664;
      if (lVar10 == 0xa1a0a0d46444889) {
LAB_0014e65a:
        iVar6 = -0xd;
        goto LAB_0014e589;
      }
    }
    if ((iVar6 == 0x42495247) && ((byte)(cStack_391 - 1U) < 2)) {
      iVar6 = coda_grib_reopen(&local_3a0);
    }
    else if ((lVar10 == 0x6c6d783f3cbfbbef) ||
            (uStack_394 == 'l' &&
             CONCAT13(bStack_395,CONCAT12(cStack_396,CONCAT11(cStack_397,local_398))) == 0x6d783f3c)
            ) {
      iVar6 = coda_xml_reopen(&local_3a0);
    }
    else {
      if (uVar2 < 0x28) goto LAB_0014e515;
      cursor = &local_340;
      iVar6 = coda_cursor_read_bytes(cursor,&uStack_390,8,0x20);
      if (iVar6 != 0) goto LAB_0014e538;
      if (((0x3b < uVar2) && (local_398 == '#')) && ((byte)(cStack_397 + 0x9fU) < 3)) {
        bVar11 = bStack_395 - 0x3a;
        bVar13 = uStack_394 - 0x3a;
        bVar14 = cStack_393 - 0x3a;
        bVar15 = cStack_392 - 0x3a;
        cVar16 = -((byte)((0xf6 < bVar11) * bVar11 | (0xf6 >= bVar11) * -10) == bVar11);
        cVar27 = -((byte)((0xf6 < bVar13) * bVar13 | (0xf6 >= bVar13) * -10) == bVar13);
        cVar28 = -((byte)((0xf6 < bVar14) * bVar14 | (0xf6 >= bVar14) * -10) == bVar14);
        cVar29 = -((byte)((0xf6 < bVar15) * bVar15 | (0xf6 >= bVar15) * -10) == bVar15);
        auVar17._0_12_ = ZEXT512(0xffffffffff) << 0x38;
        auVar17[0xc] = 0xff;
        auVar21[0xd] = 0xff;
        auVar21._0_13_ = auVar17;
        auVar21[0xe] = 0xff;
        auVar21[0xf] = 0xff;
        auVar20._14_2_ = auVar21._14_2_;
        auVar20[0xd] = 0xff;
        auVar20._0_13_ = auVar17;
        auVar19._13_3_ = auVar20._13_3_;
        auVar19[0xc] = 0xff;
        auVar19._0_12_ = auVar17._0_12_;
        Var5 = CONCAT91(CONCAT81((long)(CONCAT72((int7)(CONCAT63((int6)(CONCAT54((int5)(CONCAT45(
                                                  auVar19._12_4_,0xffffffffff) >> 0x20),0xffffffff)
                                                  >> 0x18),0xffffff) >> 0x10),0xffff) >> 8),cVar29),
                        cVar29);
        auVar4._2_10_ = Var5;
        auVar4[1] = cVar28;
        auVar4[0] = cVar28;
        auVar3._2_12_ = auVar4;
        auVar3[1] = cVar27;
        auVar3[0] = cVar27;
        auVar18._0_2_ = CONCAT11(cVar16,cVar16);
        auVar18._2_14_ = auVar3;
        uVar30 = (undefined2)Var5;
        auVar25._0_12_ = auVar18._0_12_;
        auVar25._12_2_ = uVar30;
        auVar25._14_2_ = uVar30;
        auVar24._12_4_ = auVar25._12_4_;
        auVar24._0_10_ = auVar18._0_10_;
        auVar24._10_2_ = auVar4._0_2_;
        auVar23._10_6_ = auVar24._10_6_;
        auVar23._0_8_ = auVar18._0_8_;
        auVar23._8_2_ = auVar4._0_2_;
        auVar22._8_8_ = auVar23._8_8_;
        auVar22._6_2_ = auVar3._0_2_;
        auVar22._4_2_ = auVar3._0_2_;
        auVar22._2_2_ = auVar18._0_2_;
        auVar22._0_2_ = auVar18._0_2_;
        uVar9 = movmskps((int)cursor,auVar22);
        if (((cStack_396 == 'P' || cStack_396 == 'V') &&
            (((char)uVar9 == '\x0f' && (cStack_38e == ' ' && cStack_391 == ' ')) &&
             cStack_38b == ' ')) &&
           (((local_388 == ' ' && ((cStack_385 == ' ' && (local_379 == ' ')))) && (local_371 == ' ')
            ))) {
          iVar6 = coda_sp3_reopen(&local_3a0);
          goto LAB_0014e5b2;
        }
      }
      if (uVar2 < 0x50) goto LAB_0014e515;
      iVar6 = coda_cursor_read_bytes(&local_340,&local_398,0x3c,0x14);
      if (iVar6 != 0) {
LAB_0014e538:
        coda_close(local_3a0);
        return -1;
      }
      auVar26[0] = -((char)_local_388 == 'T');
      auVar26[1] = -((char)((uint)_local_388 >> 8) == 'Y');
      auVar26[2] = -((char)((uint)_local_388 >> 0x10) == 'P');
      auVar26[3] = -((char)((uint)_local_388 >> 0x18) == 'E');
      auVar26[4] = 0xff;
      auVar26[5] = 0xff;
      auVar26[6] = 0xff;
      auVar26[7] = 0xff;
      auVar26[8] = 0xff;
      auVar26[9] = 0xff;
      auVar26[10] = 0xff;
      auVar26[0xb] = 0xff;
      auVar26[0xc] = 0xff;
      auVar26[0xd] = 0xff;
      auVar26[0xe] = 0xff;
      auVar26[0xf] = 0xff;
      auVar12[0] = -(local_398 == 'R');
      auVar12[1] = -(cStack_397 == 'I');
      auVar12[2] = -(cStack_396 == 'N');
      auVar12[3] = -(bStack_395 == 0x45);
      auVar12[4] = -(uStack_394 == 'X');
      auVar12[5] = -(cStack_393 == ' ');
      auVar12[6] = -(cStack_392 == 'V');
      auVar12[7] = -(cStack_391 == 'E');
      auVar12[8] = -(uStack_390 == 'R');
      auVar12[9] = -(cStack_38f == 'S');
      auVar12[10] = -(cStack_38e == 'I');
      auVar12[0xb] = -(cStack_38d == 'O');
      auVar12[0xc] = -(cStack_38c == 'N');
      auVar12[0xd] = -(cStack_38b == ' ');
      auVar12[0xe] = -(cStack_38a == '/');
      auVar12[0xf] = -(cStack_389 == ' ');
      auVar12 = auVar12 & auVar26;
      if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) {
        if (0x208 < uVar2) {
          lVar10 = 0x200;
          do {
            iVar6 = coda_cursor_read_bytes(&local_340,&local_398,lVar10,8);
            if (iVar6 != 0) goto LAB_0014e538;
            if (CONCAT17(cStack_391,
                         CONCAT16(cStack_392,
                                  CONCAT15(cStack_393,
                                           CONCAT14(uStack_394,
                                                    CONCAT13(bStack_395,
                                                             CONCAT12(cStack_396,
                                                                      CONCAT11(cStack_397,local_398)
                                                                     )))))) == 0xa1a0a0d46444889)
            goto LAB_0014e65a;
            lVar1 = lVar10 * 2;
            lVar10 = lVar10 * 2;
          } while (lVar1 + 8 < (long)uVar2);
        }
        goto LAB_0014e515;
      }
      iVar6 = coda_rinex_reopen(&local_3a0);
    }
  }
LAB_0014e5b2:
  if (iVar6 != 0) {
    return -1;
  }
LAB_0014e515:
  *product_file = local_3a0;
  return 0;
}

Assistant:

static int get_file_size(const char *filename, int64_t *file_size)
{
    struct stat statbuf;

    assert(filename != NULL && file_size != NULL);

    /* stat() the file to be opened */

    if (stat(filename, &statbuf) != 0)
    {
        if (errno == ENOENT)
        {
            coda_set_error(CODA_ERROR_FILE_NOT_FOUND, "could not find %s", filename);
        }
        else
        {
            coda_set_error(CODA_ERROR_FILE_OPEN, "could not open %s (%s)", filename, strerror(errno));
        }
        return -1;
    }

    /* check that the file is a regular file */

    if ((statbuf.st_mode & S_IFREG) == 0)
    {
        coda_set_error(CODA_ERROR_FILE_OPEN, "could not open %s (not a regular file)", filename);
        return -1;
    }

    /* get file size */

    *file_size = statbuf.st_size;

    return 0;
}